

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equality.cpp
# Opt level: O0

void __thiscall
Equality_resetNotEqualByTestValueId_Test::TestBody(Equality_resetNotEqualByTestValueId_Test *this)

{
  byte bVar1;
  bool bVar2;
  element_type *peVar3;
  char *pcVar4;
  AssertionResult local_118 [2];
  AssertHelper local_f8 [8];
  Message local_f0 [8];
  shared_ptr<libcellml::Entity> local_e8;
  bool local_d1;
  undefined1 local_d0 [8];
  AssertionResult gtest_ar__1;
  AssertHelper local_a0 [8];
  Message local_98 [8];
  shared_ptr<libcellml::Entity> local_90;
  bool local_79;
  undefined1 local_78 [8];
  AssertionResult gtest_ar_;
  string local_60 [48];
  undefined1 local_30 [8];
  ResetPtr r2;
  ResetPtr r1;
  Equality_resetNotEqualByTestValueId_Test *this_local;
  
  createInitialisedReset();
  createInitialisedReset();
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (local_60,"tv_alt_id",(allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  libcellml::Reset::setTestValueId((string *)peVar3);
  std::__cxx11::string::~string(local_60);
  std::allocator<char>::~allocator((allocator<char> *)((long)&gtest_ar_.message_.ptr_ + 7));
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)&r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Reset,void>
            (&local_90,(shared_ptr<libcellml::Reset> *)local_30);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_79 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_78,&local_79,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_90);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_78);
  if (!bVar2) {
    testing::Message::Message(local_98);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((AssertionResult *)&gtest_ar__1.message_,local_78,"r1->equals(r2)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_a0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x210,pcVar4);
    testing::internal::AssertHelper::operator=(local_a0,local_98);
    testing::internal::AssertHelper::~AssertHelper(local_a0);
    std::__cxx11::string::~string((string *)&gtest_ar__1.message_);
    testing::Message::~Message(local_98);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_78);
  peVar3 = std::__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)local_30);
  std::shared_ptr<libcellml::Entity>::shared_ptr<libcellml::Reset,void>
            (&local_e8,
             (shared_ptr<libcellml::Reset> *)
             &r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  bVar1 = libcellml::Entity::equals((shared_ptr *)peVar3);
  local_d1 = (bool)(~bVar1 & 1);
  testing::AssertionResult::AssertionResult<bool>((AssertionResult *)local_d0,&local_d1,(type *)0x0)
  ;
  std::shared_ptr<libcellml::Entity>::~shared_ptr(&local_e8);
  bVar2 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_d0);
  if (!bVar2) {
    testing::Message::Message(local_f0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (local_118,local_d0,"r2->equals(r1)","true");
    pcVar4 = (char *)std::__cxx11::string::c_str();
    testing::internal::AssertHelper::AssertHelper
              (local_f8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/equality/equality.cpp"
               ,0x211,pcVar4);
    testing::internal::AssertHelper::operator=(local_f8,local_f0);
    testing::internal::AssertHelper::~AssertHelper(local_f8);
    std::__cxx11::string::~string((string *)local_118);
    testing::Message::~Message(local_f0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_d0);
  std::shared_ptr<libcellml::Reset>::~shared_ptr((shared_ptr<libcellml::Reset> *)local_30);
  std::shared_ptr<libcellml::Reset>::~shared_ptr
            ((shared_ptr<libcellml::Reset> *)
             &r2.super___shared_ptr<libcellml::Reset,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

TEST(Equality, resetNotEqualByTestValueId)
{
    libcellml::ResetPtr r1 = createInitialisedReset();
    libcellml::ResetPtr r2 = createInitialisedReset();

    r1->setTestValueId("tv_alt_id");

    EXPECT_FALSE(r1->equals(r2));
    EXPECT_FALSE(r2->equals(r1));
}